

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

uint lodepng::convertToXYZ_chrm
               (float *im,uint w,uint h,LodePNGInfo *info,uint use_icc,LodePNGICC *icc,
               float *whitepoint)

{
  float *m_00;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  size_t j;
  float m [9];
  size_t n;
  size_t i;
  uint error;
  float local_78 [4];
  LodePNGInfo *in_stack_ffffffffffffff98;
  LodePNGICC *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffac;
  float *in_stack_ffffffffffffffb0;
  float *local_40;
  uint local_4;
  
  m_00 = (float *)(ulong)(uint)(in_ESI * in_EDX);
  local_4 = getChrm(m_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                    in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (local_4 == 0) {
    if ((in_R8D == 0) || (*in_R9 == 2)) {
      for (local_40 = (float *)0x0; local_40 < m_00; local_40 = (float *)((long)local_40 + 1)) {
        mulMatrix((float *)(in_RDI + (long)local_40 * 0x10),
                  (float *)(in_RDI + ((long)local_40 * 4 + 1) * 4),
                  (float *)(in_RDI + ((long)local_40 * 4 + 2) * 4),local_78,
                  (double)*(float *)(in_RDI + (long)local_40 * 0x10),
                  (double)*(float *)(in_RDI + 4 + (long)local_40 * 0x10),
                  (double)*(float *)(in_RDI + 8 + (long)local_40 * 0x10));
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned convertToXYZ_chrm(float* im, unsigned w, unsigned h,
                                  const LodePNGInfo* info, unsigned use_icc, const LodePNGICC* icc,
                                  float whitepoint[3]) {
  unsigned error = 0;
  size_t i;
  size_t n = w * h;
  float m[9]; /* XYZ to linear RGB matrix */

  /* Must be called even for grayscale, to get the correct whitepoint to output */
  error = getChrm(m, whitepoint, use_icc, icc, info);
  if(error) return error;

  /* Note: no whitepoint adaptation done to m here, because we only do the
  adaptation in convertFromXYZ (we only whitepoint adapt when going to the
  target RGB space, but here we're going from the source RGB space to XYZ) */

  /* Apply the above computed linear-RGB-to-XYZ matrix to the pixels.
  Skip the transform if it's the unit matrix (which is the case if grayscale profile) */
  if(!use_icc || icc->inputspace == 2) {
    for(i = 0; i < n; i++) {
      size_t j = i * 4;
      mulMatrix(&im[j + 0], &im[j + 1], &im[j + 2], m, im[j + 0], im[j + 1], im[j + 2]);
    }
  }

  return 0;
}